

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  byte bVar1;
  short sVar2;
  uchar *puVar3;
  size_t __n;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int cx;
  int cy;
  ushort uVar7;
  undefined8 ptr;
  int iVar8;
  uint uVar9;
  int num_vertices;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ushort *puVar13;
  ushort *puVar14;
  size_t sVar15;
  stbtt_vertex *psVar16;
  int iVar17;
  ulong uVar18;
  short sVar19;
  int was_off;
  stbtt_int32 cx_00;
  stbtt_int32 sVar20;
  stbtt_int32 cy_00;
  stbtt_int32 sVar21;
  ulong uVar22;
  int sx;
  int sy;
  long lVar23;
  long lVar24;
  byte bVar25;
  short sVar26;
  byte bVar27;
  ushort uVar28;
  int iVar29;
  uint start_off;
  float fVar30;
  float fVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  float fVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar39;
  stbtt_vertex *local_120;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  stbtt__csctx local_a8;
  stbtt__csctx count_ctx;
  
  if ((info->cff).size == 0) {
    puVar3 = info->data;
    uVar9 = stbtt__GetGlyfOffset(info,glyph_index);
    *pvertices = (stbtt_vertex *)0x0;
    iVar11 = 0;
    if (-1 < (int)uVar9) {
      uVar12 = (ulong)uVar9;
      uVar7 = CONCAT11(puVar3[uVar12],puVar3[uVar12 + 1]);
      if ((short)uVar7 < 1) {
        if ((short)((ushort)puVar3[uVar12] << 8) < 0) {
          local_120 = (stbtt_vertex *)0x0;
          uVar18 = 0;
          puVar13 = (ushort *)(puVar3 + uVar12 + 10);
          do {
            count_ctx.bounds = 0;
            count_ctx.started = 0;
            bVar25 = *(byte *)((long)puVar13 + 1);
            puVar14 = puVar13 + 2;
            if ((bVar25 & 2) == 0) {
              fVar30 = 0.0;
              fVar33 = 0.0;
            }
            else if ((bVar25 & 1) == 0) {
              fVar30 = (float)(int)(char)*puVar14;
              fVar33 = (float)(int)((long)((ulong)*(byte *)((long)puVar13 + 5) << 0x38) >> 0x38);
              puVar14 = puVar13 + 3;
            }
            else {
              auVar5._9_7_ = 0;
              auVar5._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
              auVar4._10_6_ = 0;
              auVar4._0_10_ = SUB1610(auVar5 << 0x38,6);
              auVar36._11_5_ = 0;
              auVar36._0_11_ = SUB1611(auVar4 << 0x30,5);
              auVar6._1_12_ = SUB1612(auVar36 << 0x28,4);
              auVar6[0] = (char)puVar13[3];
              auVar6._13_3_ = 0;
              auVar32._1_14_ = SUB1614(auVar6 << 0x18,2);
              auVar32[0] = (char)*puVar14;
              auVar32[0xf] = 0;
              auVar32 = ZEXT416((uint)*(byte *)((long)puVar13 + 7) << 0x10 |
                                (uint)*(byte *)((long)puVar13 + 5)) | auVar32 << 8;
              fVar30 = (float)(int)auVar32._0_2_;
              fVar33 = (float)(int)auVar32._2_2_;
              puVar14 = puVar13 + 4;
            }
            if ((bVar25 & 8) == 0) {
              if ((bVar25 & 0x40) != 0) {
                uVar7 = *puVar14;
                fVar37 = (float)(int)(short)(puVar14[1] << 8 | puVar14[1] >> 8) * 6.1035156e-05;
                puVar14 = puVar14 + 2;
                _local_c8 = ZEXT416((uint)((float)(int)(short)(uVar7 << 8 | uVar7 >> 8) *
                                          6.1035156e-05));
                goto LAB_001abc74;
              }
              if ((char)bVar25 < '\0') {
                local_c8._0_4_ =
                     (float)(int)CONCAT11((char)*puVar14,*(char *)((long)puVar14 + 1)) *
                     6.1035156e-05;
                local_c8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)puVar14[2],
                                                         *(char *)((long)puVar14 + 5)) << 0x30) >>
                                 0x30) * 6.1035156e-05;
                register0x00001288 = 0;
                local_108._0_4_ =
                     (float)(int)CONCAT11((char)puVar14[1],*(char *)((long)puVar14 + 3)) *
                     6.1035156e-05;
                local_108._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)puVar14[3],
                                                         *(char *)((long)puVar14 + 7)) << 0x30) >>
                                 0x30) * 6.1035156e-05;
                register0x00001248 = 0;
                puVar14 = puVar14 + 4;
              }
              else {
                _local_c8 = ZEXT812(0x3f800000);
                fStack_bc = 0.0;
                _local_108 = ZEXT816(0x3f80000000000000);
              }
            }
            else {
              fVar37 = (float)(int)(short)(*puVar14 << 8 | *puVar14 >> 8) * 6.1035156e-05;
              puVar14 = puVar14 + 1;
              register0x00001244 = SUB1612((undefined1  [16])0x0,4);
              local_c8._0_4_ = fVar37;
LAB_001abc74:
              _local_108 = ZEXT416((uint)fVar37) << 0x20;
            }
            uVar9 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar13[1] << 8 | puVar13[1] >> 8),
                                        (stbtt_vertex **)&count_ctx);
            ptr = count_ctx._0_8_;
            if (0 < (int)uVar9) {
              auVar31._0_4_ = (float)local_108._0_4_ * (float)local_108._0_4_;
              auVar31._4_4_ = (float)local_108._4_4_ * (float)local_108._4_4_;
              auVar31._8_4_ = fStack_100 * fStack_100;
              auVar31._12_4_ = fStack_fc * fStack_fc;
              auVar34._0_4_ = (float)local_c8._0_4_ * (float)local_c8._0_4_ + auVar31._0_4_;
              auVar34._4_4_ = (float)local_c8._4_4_ * (float)local_c8._4_4_ + auVar31._4_4_;
              auVar34._8_4_ = fStack_c0 * fStack_c0 + auVar31._8_4_;
              auVar34._12_4_ = fStack_bc * fStack_bc + auVar31._12_4_;
              auVar32 = sqrtps(auVar31,auVar34);
              __n = (ulong)uVar9 * 0xe;
              sVar15 = 0;
              do {
                fVar37 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 4 + sVar15) <<
                                            0x30) >> 0x30);
                fVar38 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + sVar15);
                fVar39 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 6 + sVar15) <<
                                            0x30) >> 0x30);
                auVar35._0_4_ =
                     (int)((fVar38 * (float)local_c8._4_4_ +
                            (float)(int)*(short *)(count_ctx._0_8_ + sVar15) * (float)local_c8._0_4_
                           + fVar30) * auVar32._0_4_);
                auVar35._4_4_ =
                     (int)((fVar38 * (float)local_108._4_4_ +
                            (float)(int)*(short *)(count_ctx._0_8_ + sVar15) *
                            (float)local_108._0_4_ + fVar33) * auVar32._4_4_);
                auVar35._8_4_ =
                     (int)((fVar39 * (float)local_c8._4_4_ + fVar37 * (float)local_c8._0_4_ + fVar30
                           ) * auVar32._0_4_);
                auVar35._12_4_ =
                     (int)((fVar39 * (float)local_108._4_4_ + fVar37 * (float)local_108._0_4_ +
                           fVar33) * auVar32._4_4_);
                auVar36 = packssdw(auVar35,auVar35);
                *(long *)(count_ctx._0_8_ + sVar15) = auVar36._0_8_;
                sVar15 = sVar15 + 0xe;
              } while (__n != sVar15);
              uVar12 = (ulong)(uVar9 + (int)uVar18);
              psVar16 = (stbtt_vertex *)ImGui::MemAlloc(uVar12 * 0xe);
              if (psVar16 == (stbtt_vertex *)0x0) {
                if (local_120 != (stbtt_vertex *)0x0) {
                  ImGui::MemFree(local_120);
                }
                ImGui::MemFree((void *)ptr);
                return 0;
              }
              if (((int)uVar18 < 1) || (local_120 == (stbtt_vertex *)0x0)) {
                memcpy(psVar16 + uVar18,(void *)ptr,__n);
                if (local_120 != (stbtt_vertex *)0x0) goto LAB_001abdee;
              }
              else {
                memcpy(psVar16,local_120,uVar18 * 0xe);
                memcpy(psVar16 + uVar18,(void *)ptr,__n);
LAB_001abdee:
                ImGui::MemFree(local_120);
              }
              ImGui::MemFree((void *)ptr);
              uVar18 = uVar12;
              local_120 = psVar16;
            }
            iVar11 = (int)uVar18;
            puVar13 = puVar14;
          } while ((bVar25 & 0x20) != 0);
        }
        else {
          iVar11 = 0;
          local_120 = (stbtt_vertex *)0x0;
        }
      }
      else {
        uVar9 = (uint)uVar7 * 2;
        uVar18 = (ulong)uVar9;
        bVar25 = puVar3[uVar18 + uVar12 + 10];
        bVar27 = puVar3[uVar18 + uVar12 + 0xb];
        bVar1 = puVar3[uVar18 + uVar12 + 9];
        iVar11 = (uint)puVar3[uVar18 + uVar12 + 8] * 0x100;
        local_120 = (stbtt_vertex *)
                    ImGui::MemAlloc((ulong)(((uint)bVar1 + iVar11 + (uint)uVar7 * 2) * 0xe + 0xe));
        if (local_120 == (stbtt_vertex *)0x0) {
          return 0;
        }
        puVar13 = (ushort *)(puVar3 + (ulong)bVar25 * 0x100 + (ulong)bVar27 + uVar18 + uVar12 + 0xc)
        ;
        uVar18 = uVar18 & 0xffff;
        iVar8 = (int)uVar18;
        uVar22 = (ulong)(iVar11 + (uint)bVar1);
        lVar23 = 0;
        bVar25 = 0;
        bVar27 = 0;
        do {
          if (bVar27 == 0) {
            bVar25 = (byte)*puVar13;
            if ((bVar25 & 8) == 0) {
              puVar13 = (ushort *)((long)puVar13 + 1);
              bVar27 = 0;
            }
            else {
              bVar27 = *(byte *)((long)puVar13 + 1);
              puVar13 = puVar13 + 1;
            }
          }
          else {
            bVar27 = bVar27 - 1;
          }
          *(byte *)((long)local_120 + lVar23 + (ulong)(uint)(iVar8 << 4) + uVar18 * -2 + 0xc) =
               bVar25;
          lVar23 = lVar23 + 0xe;
        } while ((ulong)(((uint)bVar1 + iVar11 + 1) * 0x10) - (uVar22 * 2 + 2) != lVar23);
        lVar23 = (ulong)(uint)(iVar8 << 4) + uVar18 * -2;
        lVar24 = 0;
        sVar26 = 0;
        do {
          bVar25 = *(byte *)((long)local_120 + lVar24 + lVar23 + 0xc);
          if ((bVar25 & 2) == 0) {
            if ((bVar25 & 0x10) == 0) {
              sVar26 = sVar26 + (*puVar13 << 8 | *puVar13 >> 8);
              puVar13 = puVar13 + 1;
            }
          }
          else {
            uVar7 = *puVar13;
            puVar13 = (ushort *)((long)puVar13 + 1);
            uVar28 = -(ushort)(byte)uVar7;
            if ((bVar25 & 0x10) != 0) {
              uVar28 = (ushort)(byte)uVar7;
            }
            sVar26 = sVar26 + uVar28;
          }
          *(short *)((long)local_120 + lVar24 + lVar23) = sVar26;
          lVar24 = lVar24 + 0xe;
        } while ((ulong)((iVar11 + (uint)bVar1 + 1) * 0x10) - (uVar22 * 2 + 2) != lVar24);
        lVar23 = (ulong)(uint)(iVar8 << 4) + uVar18 * -2;
        lVar24 = 0;
        sVar26 = 0;
        do {
          bVar25 = *(byte *)((long)local_120 + lVar24 + lVar23 + 0xc);
          if ((bVar25 & 4) == 0) {
            if ((bVar25 & 0x20) == 0) {
              sVar26 = sVar26 + (*puVar13 << 8 | *puVar13 >> 8);
              puVar13 = puVar13 + 1;
            }
          }
          else {
            uVar7 = *puVar13;
            puVar13 = (ushort *)((long)puVar13 + 1);
            uVar28 = -(ushort)(byte)uVar7;
            if ((bVar25 & 0x20) != 0) {
              uVar28 = (ushort)(byte)uVar7;
            }
            sVar26 = sVar26 + uVar28;
          }
          *(short *)((long)local_120 + lVar24 + lVar23 + 2) = sVar26;
          lVar24 = lVar24 + 0xe;
        } while ((ulong)((iVar11 + (uint)bVar1 + 1) * 0x10) - (uVar22 * 2 + 2) != lVar24);
        num_vertices = 0;
        iVar8 = 0;
        iVar17 = 0;
        iVar10 = 0;
        sVar21 = 0;
        sVar20 = 0;
        sy = 0;
        sx = 0;
        start_off = 0;
        was_off = 0;
        cx = 0;
        cy = 0;
        do {
          lVar23 = (long)(int)(uVar9 + iVar8);
          bVar25 = local_120[lVar23].type;
          sVar26 = local_120[lVar23].x;
          sVar2 = local_120[lVar23].y;
          cx_00 = (stbtt_int32)sVar26;
          cy_00 = (stbtt_int32)sVar2;
          if (iVar10 == iVar8) {
            if (iVar8 != 0) {
              num_vertices = stbtt__close_shape(local_120,num_vertices,was_off,start_off,sx,sy,
                                                sVar20,sVar21,cx,cy);
            }
            sx = cx_00;
            sy = cy_00;
            if ((bVar25 & 1) == 0) {
              sVar20 = cx_00;
              sVar21 = cy_00;
              if ((local_120[lVar23 + 1].type & 1) == 0) {
                sx = local_120[lVar23 + 1].x + cx_00 >> 1;
                sy = local_120[lVar23 + 1].y + cy_00 >> 1;
              }
              else {
                iVar8 = iVar8 + 1;
                sx = (int)local_120[lVar23 + 1].x;
                sy = (int)local_120[lVar23 + 1].y;
              }
            }
            start_off = bVar25 & 1 ^ 1;
            local_120[num_vertices].type = '\x01';
            local_120[num_vertices].x = (short)sx;
            local_120[num_vertices].y = (short)sy;
            local_120[num_vertices].cx = 0;
            local_120[num_vertices].cy = 0;
            iVar10 = (ushort)(*(ushort *)(puVar3 + (long)iVar17 * 2 + uVar12 + 10) << 8 |
                             *(ushort *)(puVar3 + (long)iVar17 * 2 + uVar12 + 10) >> 8) + 1;
            iVar17 = iVar17 + 1;
            was_off = 0;
            iVar29 = iVar8;
            num_vertices = num_vertices + 1;
            cx_00 = cx;
            cy_00 = cy;
          }
          else {
            sVar19 = (short)cy;
            iVar29 = iVar8;
            if ((bVar25 & 1) == 0) {
              iVar8 = num_vertices;
              if (was_off != 0) {
                iVar8 = num_vertices + 1;
                local_120[num_vertices].type = '\x03';
                local_120[num_vertices].x = (short)((uint)(cx + cx_00) >> 1);
                local_120[num_vertices].y = (short)((uint)(cy + cy_00) >> 1);
                local_120[num_vertices].cx = (short)cx;
                local_120[num_vertices].cy = sVar19;
              }
              was_off = 1;
              num_vertices = iVar8;
            }
            else {
              psVar16 = local_120 + num_vertices;
              if (was_off == 0) {
                psVar16->type = '\x02';
                psVar16->x = sVar26;
                psVar16->y = sVar2;
                psVar16->cx = 0;
                sVar19 = 0;
              }
              else {
                psVar16->type = '\x03';
                psVar16->x = sVar26;
                psVar16->y = sVar2;
                psVar16->cx = (short)cx;
              }
              psVar16->cy = sVar19;
              was_off = 0;
              num_vertices = num_vertices + 1;
              cx_00 = cx;
              cy_00 = cy;
            }
          }
          iVar8 = iVar29 + 1;
          cx = cx_00;
          cy = cy_00;
        } while (iVar29 < (int)((uint)bVar1 + iVar11));
        iVar11 = stbtt__close_shape(local_120,num_vertices,was_off,start_off,sx,sy,sVar20,sVar21,
                                    cx_00,cy_00);
      }
      *pvertices = local_120;
    }
  }
  else {
    count_ctx.first_x = 0.0;
    count_ctx.first_y = 0.0;
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    iVar11 = 0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx.bounds = 1;
    count_ctx.started = 0;
    local_a8.num_vertices = 0;
    local_a8._52_4_ = 0;
    local_a8.min_y = 0;
    local_a8.max_y = 0;
    local_a8.pvertices = (stbtt_vertex *)0x0;
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    local_a8.min_x = 0;
    local_a8.max_x = 0;
    local_a8.bounds = 0;
    local_a8.started = 0;
    local_a8.first_x = 0.0;
    local_a8.first_y = 0.0;
    iVar8 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar8 != 0) {
      local_a8.pvertices = (stbtt_vertex *)ImGui::MemAlloc((long)count_ctx.num_vertices * 0xe);
      *pvertices = local_a8.pvertices;
      iVar8 = stbtt__run_charstring(info,glyph_index,&local_a8);
      if (iVar8 != 0) {
        return local_a8.num_vertices;
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
  }
  return iVar11;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   if (!info->cff.size)
      return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
   else
      return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}